

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stb_image_aug.c
# Opt level: O0

void idct_block(uint8 *out,int out_stride,short *data,uint8 *dequantize)

{
  uint8 uVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  int iVar5;
  int iVar6;
  int iVar7;
  int iVar8;
  int iVar9;
  int iVar10;
  int iVar11;
  int iVar12;
  int iVar13;
  int x3_1;
  int x2_1;
  int x1_1;
  int x0_1;
  int p5_1;
  int p4_1;
  int p3_1;
  int p2_1;
  int p1_1;
  int t3_1;
  int t2_1;
  int t1_1;
  int t0_1;
  int x3;
  int x2;
  int x1;
  int x0;
  int p5;
  int p4;
  int p3;
  int p2;
  int p1;
  int t3;
  int t2;
  int t1;
  int t0;
  int dcterm;
  short *d;
  uint8 *dq;
  uint8 *o;
  int *v;
  int val [64];
  int local_2c;
  int i;
  uint8 *dequantize_local;
  short *data_local;
  int out_stride_local;
  uint8 *out_local;
  
  o = (uint8 *)&v;
  _t0 = data;
  d = (short *)dequantize;
  for (local_2c = 0; local_2c < 8; local_2c = local_2c + 1) {
    if ((((_t0[8] == 0) && (_t0[0x10] == 0)) && (_t0[0x18] == 0)) &&
       (((_t0[0x20] == 0 && (_t0[0x28] == 0)) && ((_t0[0x30] == 0 && (_t0[0x38] == 0)))))) {
      iVar2 = (int)*_t0 * (uint)(byte)*d * 4;
      *(int *)(o + 0xe0) = iVar2;
      *(int *)(o + 0xc0) = iVar2;
      *(int *)(o + 0xa0) = iVar2;
      *(int *)(o + 0x80) = iVar2;
      *(int *)(o + 0x60) = iVar2;
      *(int *)(o + 0x40) = iVar2;
      *(int *)(o + 0x20) = iVar2;
      *(int *)o = iVar2;
    }
    else {
      iVar3 = ((int)_t0[0x10] * (uint)*(byte *)(d + 8) + (int)_t0[0x30] * (uint)*(byte *)(d + 0x18))
              * 0x8a9;
      iVar2 = iVar3 + (int)_t0[0x30] * (uint)*(byte *)(d + 0x18) * -0x1d8f;
      iVar3 = iVar3 + (int)_t0[0x10] * (uint)*(byte *)(d + 8) * 0xc3f;
      iVar4 = (int)*_t0 * (uint)(byte)*d;
      iVar5 = (iVar4 + (int)_t0[0x20] * (uint)*(byte *)(d + 0x10)) * 0x1000;
      iVar4 = (iVar4 - (int)_t0[0x20] * (uint)*(byte *)(d + 0x10)) * 0x1000;
      iVar6 = (int)_t0[0x38] * (uint)*(byte *)(d + 0x1c);
      iVar7 = (int)_t0[0x28] * (uint)*(byte *)(d + 0x14);
      iVar8 = (int)_t0[0x18] * (uint)*(byte *)(d + 0xc);
      iVar9 = (int)_t0[8] * (uint)*(byte *)(d + 4);
      iVar10 = (iVar6 + iVar8 + iVar7 + iVar9) * 0x12d0;
      iVar11 = iVar10 + (iVar6 + iVar9) * -0xe65;
      iVar10 = iVar10 + (iVar7 + iVar8) * -0x2901;
      iVar12 = (iVar6 + iVar8) * -0x1f62;
      iVar13 = (iVar7 + iVar9) * -0x63d;
      iVar9 = iVar11 + iVar13 + iVar9 * 0x1805;
      iVar8 = iVar10 + iVar12 + iVar8 * 0x312a;
      iVar7 = iVar10 + iVar13 + iVar7 * 0x20da;
      iVar6 = iVar11 + iVar12 + iVar6 * 0x4c7;
      iVar11 = iVar5 + iVar3 + 0x200;
      iVar10 = iVar4 + iVar2 + 0x200;
      iVar2 = (iVar4 - iVar2) + 0x200;
      iVar3 = (iVar5 - iVar3) + 0x200;
      *(int *)o = iVar11 + iVar9 >> 10;
      *(int *)(o + 0xe0) = iVar11 - iVar9 >> 10;
      *(int *)(o + 0x20) = iVar10 + iVar8 >> 10;
      *(int *)(o + 0xc0) = iVar10 - iVar8 >> 10;
      *(int *)(o + 0x40) = iVar2 + iVar7 >> 10;
      *(int *)(o + 0xa0) = iVar2 - iVar7 >> 10;
      *(int *)(o + 0x60) = iVar3 + iVar6 >> 10;
      *(int *)(o + 0x80) = iVar3 - iVar6 >> 10;
    }
    _t0 = _t0 + 1;
    d = (short *)((long)d + 1);
    o = o + 4;
  }
  o = (uint8 *)&v;
  dq = out;
  for (local_2c = 0; local_2c < 8; local_2c = local_2c + 1) {
    iVar7 = (*(int *)(o + 8) + *(int *)(o + 0x18)) * 0x8a9;
    iVar6 = iVar7 + *(int *)(o + 0x18) * -0x1d8f;
    iVar7 = iVar7 + *(int *)(o + 8) * 0xc3f;
    iVar8 = (*(int *)o + *(int *)(o + 0x10)) * 0x1000;
    iVar9 = (*(int *)o - *(int *)(o + 0x10)) * 0x1000;
    iVar2 = *(int *)(o + 0x1c);
    iVar3 = *(int *)(o + 0x14);
    iVar4 = *(int *)(o + 0xc);
    iVar5 = *(int *)(o + 4);
    iVar10 = (iVar2 + iVar4 + iVar3 + iVar5) * 0x12d0;
    iVar11 = iVar10 + (iVar2 + iVar5) * -0xe65;
    iVar10 = iVar10 + (iVar3 + iVar4) * -0x2901;
    iVar12 = (iVar2 + iVar4) * -0x1f62;
    iVar13 = (iVar3 + iVar5) * -0x63d;
    iVar5 = iVar11 + iVar13 + iVar5 * 0x1805;
    iVar4 = iVar10 + iVar12 + iVar4 * 0x312a;
    iVar3 = iVar10 + iVar13 + iVar3 * 0x20da;
    iVar2 = iVar11 + iVar12 + iVar2 * 0x4c7;
    iVar11 = iVar8 + iVar7 + 0x10000;
    iVar10 = iVar9 + iVar6 + 0x10000;
    iVar6 = (iVar9 - iVar6) + 0x10000;
    iVar7 = (iVar8 - iVar7) + 0x10000;
    uVar1 = clamp(iVar11 + iVar5 >> 0x11);
    *dq = uVar1;
    uVar1 = clamp(iVar11 - iVar5 >> 0x11);
    dq[7] = uVar1;
    uVar1 = clamp(iVar10 + iVar4 >> 0x11);
    dq[1] = uVar1;
    uVar1 = clamp(iVar10 - iVar4 >> 0x11);
    dq[6] = uVar1;
    uVar1 = clamp(iVar6 + iVar3 >> 0x11);
    dq[2] = uVar1;
    uVar1 = clamp(iVar6 - iVar3 >> 0x11);
    dq[5] = uVar1;
    uVar1 = clamp(iVar7 + iVar2 >> 0x11);
    dq[3] = uVar1;
    uVar1 = clamp(iVar7 - iVar2 >> 0x11);
    dq[4] = uVar1;
    o = o + 0x20;
    dq = dq + out_stride;
  }
  return;
}

Assistant:

static void idct_block(uint8 *out, int out_stride, short data[64], uint8 *dequantize)
{
   int i,val[64],*v=val;
   uint8 *o,*dq = dequantize;
   short *d = data;

   // columns
   for (i=0; i < 8; ++i,++d,++dq, ++v) {
      // if all zeroes, shortcut -- this avoids dequantizing 0s and IDCTing
      if (d[ 8]==0 && d[16]==0 && d[24]==0 && d[32]==0
           && d[40]==0 && d[48]==0 && d[56]==0) {
         //    no shortcut                 0     seconds
         //    (1|2|3|4|5|6|7)==0          0     seconds
         //    all separate               -0.047 seconds
         //    1 && 2|3 && 4|5 && 6|7:    -0.047 seconds
         int dcterm = d[0] * dq[0] << 2;
         v[0] = v[8] = v[16] = v[24] = v[32] = v[40] = v[48] = v[56] = dcterm;
      } else {
         IDCT_1D(d[ 0]*dq[ 0],d[ 8]*dq[ 8],d[16]*dq[16],d[24]*dq[24],
                 d[32]*dq[32],d[40]*dq[40],d[48]*dq[48],d[56]*dq[56])
         // constants scaled things up by 1<<12; let's bring them back
         // down, but keep 2 extra bits of precision
         x0 += 512; x1 += 512; x2 += 512; x3 += 512;
         v[ 0] = (x0+t3) >> 10;
         v[56] = (x0-t3) >> 10;
         v[ 8] = (x1+t2) >> 10;
         v[48] = (x1-t2) >> 10;
         v[16] = (x2+t1) >> 10;
         v[40] = (x2-t1) >> 10;
         v[24] = (x3+t0) >> 10;
         v[32] = (x3-t0) >> 10;
      }
   }

   for (i=0, v=val, o=out; i < 8; ++i,v+=8,o+=out_stride) {
      // no fast case since the first 1D IDCT spread components out
      IDCT_1D(v[0],v[1],v[2],v[3],v[4],v[5],v[6],v[7])
      // constants scaled things up by 1<<12, plus we had 1<<2 from first
      // loop, plus horizontal and vertical each scale by sqrt(8) so together
      // we've got an extra 1<<3, so 1<<17 total we need to remove.
      x0 += 65536; x1 += 65536; x2 += 65536; x3 += 65536;
      o[0] = clamp((x0+t3) >> 17);
      o[7] = clamp((x0-t3) >> 17);
      o[1] = clamp((x1+t2) >> 17);
      o[6] = clamp((x1-t2) >> 17);
      o[2] = clamp((x2+t1) >> 17);
      o[5] = clamp((x2-t1) >> 17);
      o[3] = clamp((x3+t0) >> 17);
      o[4] = clamp((x3-t0) >> 17);
   }
}